

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTextureApiTests.cpp
# Opt level: O3

void deqp::gles31::Functional::NegativeTestShared::compressedtexsubimage2d_invalid_buffer_target
               (NegativeTestContext *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 *data;
  value_type_conflict5 *__val;
  deUint32 buf;
  deUint32 texture;
  string local_38;
  
  buf = 0x1234;
  texture = 0x1234;
  data = (undefined8 *)operator_new(0x80);
  *data = 0;
  data[1] = 0;
  data[2] = 0;
  data[3] = 0;
  data[4] = 0;
  data[5] = 0;
  data[6] = 0;
  data[7] = 0;
  data[8] = 0;
  data[9] = 0;
  data[10] = 0;
  data[0xb] = 0;
  data[0xc] = 0;
  data[0xd] = 0;
  data[0xe] = 0;
  data[0xf] = 0;
  glu::CallLogWrapper::glGenTextures(&ctx->super_CallLogWrapper,1,&texture);
  glu::CallLogWrapper::glBindTexture(&ctx->super_CallLogWrapper,0xde1,texture);
  glu::CallLogWrapper::glCompressedTexImage2D
            (&ctx->super_CallLogWrapper,0xde1,0,0x9278,0x10,0x10,0,0x100,(void *)0x0);
  glu::CallLogWrapper::glGenBuffers(&ctx->super_CallLogWrapper,1,&buf);
  glu::CallLogWrapper::glBindBuffer(&ctx->super_CallLogWrapper,0x88ec,buf);
  glu::CallLogWrapper::glBufferData(&ctx->super_CallLogWrapper,0x88ec,0x80,data,0x88ea);
  NegativeTestContext::expectError(ctx,0);
  paVar1 = &local_38.field_2;
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,
             "GL_INVALID_OPERATION is generated if a non-zero buffer object name is bound to the GL_PIXEL_UNPACK_BUFFER target and..."
             ,"");
  NegativeTestContext::beginSection(ctx,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"...the buffer object\'s data store is currently mapped.","");
  NegativeTestContext::beginSection(ctx,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glMapBufferRange(&ctx->super_CallLogWrapper,0x88ec,0,0x80,2);
  glu::CallLogWrapper::glCompressedTexSubImage2D
            (&ctx->super_CallLogWrapper,0xde1,0,0,0,4,4,0x9278,0x10,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glUnmapBuffer(&ctx->super_CallLogWrapper,0x88ec);
  NegativeTestContext::endSection(ctx);
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,
             "...the data would be unpacked from the buffer object such that the memory reads required would exceed the data store size."
             ,"");
  NegativeTestContext::beginSection(ctx,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glCompressedTexSubImage2D
            (&ctx->super_CallLogWrapper,0xde1,0,0,0,0x10,0x10,0x9278,0x100,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x502);
  NegativeTestContext::endSection(ctx);
  NegativeTestContext::endSection(ctx);
  glu::CallLogWrapper::glDeleteBuffers(&ctx->super_CallLogWrapper,1,&buf);
  glu::CallLogWrapper::glDeleteTextures(&ctx->super_CallLogWrapper,1,&texture);
  operator_delete(data,0x80);
  return;
}

Assistant:

void compressedtexsubimage2d_invalid_buffer_target (NegativeTestContext& ctx)
{
	deUint32					buf = 0x1234;
	deUint32					texture = 0x1234;
	std::vector<GLubyte>		data(128);

	ctx.glGenTextures				(1, &texture);
	ctx.glBindTexture				(GL_TEXTURE_2D, texture);
	ctx.glCompressedTexImage2D		(GL_TEXTURE_2D, 0, GL_COMPRESSED_RGBA8_ETC2_EAC, 16, 16, 0, etc2EacDataSize(16, 16), 0);
	ctx.glGenBuffers				(1, &buf);
	ctx.glBindBuffer				(GL_PIXEL_UNPACK_BUFFER, buf);
	ctx.glBufferData				(GL_PIXEL_UNPACK_BUFFER, 128, &data[0], GL_DYNAMIC_COPY);
	ctx.expectError					(GL_NO_ERROR);

	ctx.beginSection("GL_INVALID_OPERATION is generated if a non-zero buffer object name is bound to the GL_PIXEL_UNPACK_BUFFER target and...");
	ctx.beginSection("...the buffer object's data store is currently mapped.");
	ctx.glMapBufferRange			(GL_PIXEL_UNPACK_BUFFER, 0, 128, GL_MAP_WRITE_BIT);
	ctx.glCompressedTexSubImage2D	(GL_TEXTURE_2D, 0, 0, 0, 4, 4, GL_COMPRESSED_RGBA8_ETC2_EAC, etc2EacDataSize(4, 4), 0);
	ctx.expectError					(GL_INVALID_OPERATION);
	ctx.glUnmapBuffer				(GL_PIXEL_UNPACK_BUFFER);
	ctx.endSection();

	ctx.beginSection("...the data would be unpacked from the buffer object such that the memory reads required would exceed the data store size.");
	ctx.glCompressedTexSubImage2D	(GL_TEXTURE_2D, 0, 0, 0, 16, 16, GL_COMPRESSED_RGBA8_ETC2_EAC, etc2EacDataSize(16, 16), 0);
	ctx.expectError					(GL_INVALID_OPERATION);
	ctx.endSection();
	ctx.endSection();

	ctx.glDeleteBuffers			(1, &buf);
	ctx.glDeleteTextures		(1, &texture);
}